

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O1

void UnityFail(char *msg,UNITY_UINT line)

{
  if (Unity.CurrentTestIgnored == 0 && Unity.CurrentTestFailed == 0) {
    UnityTestResultsBegin(Unity.TestFile,line);
    UnityPrint("FAIL");
    if (msg != (char *)0x0) {
      putchar(0x3a);
      if (Unity.CurrentDetail1 != (char *)0x0) {
        UnityPrint("Function ");
        UnityPrint(Unity.CurrentDetail1);
        if (Unity.CurrentDetail2 != (char *)0x0) {
          UnityPrint(" Argument ");
          UnityPrint(Unity.CurrentDetail2);
        }
        UnityPrint(". ");
      }
      if (*msg != ' ') {
        putchar(0x20);
      }
      UnityPrint(msg);
    }
    Unity.CurrentTestFailed = 1;
  }
  longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
}

Assistant:

void UnityFail(const char* msg, const UNITY_LINE_TYPE line)
{
    RETURN_IF_FAIL_OR_IGNORE;

    UnityTestResultsBegin(Unity.TestFile, line);
    UnityPrint(UnityStrFail);
    if (msg != NULL)
    {
        UNITY_OUTPUT_CHAR(':');

#ifdef UNITY_PRINT_TEST_CONTEXT
        UNITY_PRINT_TEST_CONTEXT();
#endif
#ifndef UNITY_EXCLUDE_DETAILS
        if (Unity.CurrentDetail1)
        {
            UnityPrint(UnityStrDetail1Name);
            UnityPrint(Unity.CurrentDetail1);
            if (Unity.CurrentDetail2)
            {
                UnityPrint(UnityStrDetail2Name);
                UnityPrint(Unity.CurrentDetail2);
            }
            UnityPrint(UnityStrSpacer);
        }
#endif
        if (msg[0] != ' ')
        {
            UNITY_OUTPUT_CHAR(' ');
        }
        UnityPrint(msg);
    }

    UNITY_FAIL_AND_BAIL;
}